

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c++
# Opt level: O3

CappedArray<char,_32UL> *
kj::operator*(CappedArray<char,_32UL> *__return_storage_ptr__,unsigned_long param_2)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  unsigned_long i;
  long lVar6;
  long lVar7;
  bool bVar8;
  CappedArray<char,_26UL> digits;
  StringPtr local_88;
  CappedArray<char,_26UL> local_78;
  ArrayPtr<char> local_50;
  StringPtr local_40;
  ArrayPtr<char> local_30;
  
  i = -param_2;
  if (0 < (long)param_2) {
    i = param_2;
  }
  _::Stringifier::operator*(&local_78,(Stringifier *)&_::STR,i);
  if (local_78.currentSize < 10) {
    if (local_78.currentSize < 7) {
      if (local_78.currentSize < 4) {
        pcVar5 = "ns";
        local_88.content.ptr = "ns";
        lVar7 = 1;
        local_88.content.size_ = 3;
        local_30.size_ = local_78.currentSize;
      }
      else {
        pcVar5 = anon_var_dwarf_34ecbc;
        local_88.content.ptr = anon_var_dwarf_34ecbc;
        lVar7 = 1000;
        local_88.content.size_ = 4;
        local_30.size_ = local_78.currentSize - 3;
      }
    }
    else {
      pcVar5 = "ms";
      local_88.content.ptr = "ms";
      lVar7 = 1000000;
      local_88.content.size_ = 3;
      local_30.size_ = local_78.currentSize - 6;
    }
  }
  else {
    pcVar5 = "s";
    local_88.content.ptr = "s";
    lVar7 = 1000000000;
    local_88.content.size_ = 2;
    local_30.size_ = local_78.currentSize - 9;
  }
  __return_storage_ptr__->currentSize = 0x20;
  lVar6 = 8;
  if ((long)param_2 < 0) {
    __return_storage_ptr__->content[0] = '-';
    lVar6 = 9;
  }
  pcVar3 = __return_storage_ptr__->content + lVar6 + -8;
  if ((long)param_2 % lVar7 == 0) {
    if (local_30.size_ != 0) {
      uVar4 = 0;
      do {
        if (lVar6 + uVar4 == 0x28) {
          pcVar3 = pcVar3 + uVar4;
          goto LAB_001ddb5a;
        }
        pcVar3[uVar4] = local_78.content[uVar4];
        uVar4 = uVar4 + 1;
      } while (local_30.size_ != uVar4);
      lVar6 = lVar6 + uVar4;
    }
    if (lVar6 == 0x28 || pcVar5 == pcVar5 + (local_88.content.size_ - 1)) {
      pcVar3 = __return_storage_ptr__->content + lVar6 + -8;
    }
    else {
      lVar7 = 0;
      do {
        __return_storage_ptr__->content[lVar7 + lVar6 + -8] = pcVar5[lVar7];
        lVar1 = lVar7 + 1;
        if (local_88.content.size_ - 2 == lVar7) break;
        bVar8 = 0x27 - lVar6 != lVar7;
        lVar7 = lVar1;
      } while (bVar8);
      pcVar3 = __return_storage_ptr__->content + lVar1 + lVar6 + -8;
    }
  }
  else {
    local_30.ptr = local_78.content;
    pcVar5 = local_78.content + (local_78.currentSize - 1);
    local_50.size_ = (local_78.currentSize - local_30.size_) + 1;
    do {
      local_50.size_ = local_50.size_ - 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + -1;
    } while (cVar2 == '0');
    local_40.content.ptr = ".";
    local_40.content.size_ = 2;
    local_50.ptr = local_30.ptr + local_30.size_;
    pcVar3 = _::fillLimited<kj::ArrayPtr<char>,kj::StringPtr,kj::ArrayPtr<char>,kj::StringPtr&>
                       (pcVar3,(char *)(__return_storage_ptr__ + 1),&local_30,&local_40,&local_50,
                        &local_88);
  }
LAB_001ddb5a:
  __return_storage_ptr__->currentSize = (long)pcVar3 - (long)__return_storage_ptr__->content;
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, _::TIME_STR_LEN> KJ_STRINGIFY(Duration d) {
  bool negative = d < 0 * kj::SECONDS;
  uint64_t ns = d / kj::NANOSECONDS;
  if (negative) {
    ns = -ns;
  }

  auto digits = kj::toCharSequence(ns);
  ArrayPtr<char> arr = digits;

  size_t point;
  kj::StringPtr suffix;
  kj::Duration unit;
  if (digits.size() > 9) {
    point = arr.size() - 9;
    suffix = "s";
    unit = kj::SECONDS;
  } else if (digits.size() > 6) {
    point = arr.size() - 6;
    suffix = "ms";
    unit = kj::MILLISECONDS;
  } else if (digits.size() > 3) {
    point = arr.size() - 3;
    suffix = "μs";
    unit = kj::MICROSECONDS;
  } else {
    point = arr.size();
    suffix = "ns";
    unit = kj::NANOSECONDS;
  }

  CappedArray<char, _::TIME_STR_LEN> result;
  char* begin = result.begin();
  char* end;
  if (negative) {
    *begin++ = '-';
  }
  if (d % unit == 0 * kj::NANOSECONDS) {
    end = _::fillLimited(begin, result.end(), arr.first(point), suffix);
  } else {
    while (arr.back() == '0') {
      arr = arr.first(arr.size() - 1);
    }
    KJ_DASSERT(arr.size() > point);
    end = _::fillLimited(begin, result.end(), arr.first(point), "."_kj,
        arr.slice(point, arr.size()), suffix);
  }
  result.setSize(end - result.begin());
  return result;
}